

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineColorBlendAdvancedStateCreateInfoEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineColorBlendAdvancedStateCreateInfoEXT>
          (Impl *this,VkPipelineColorBlendAdvancedStateCreateInfoEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPipelineColorBlendAdvancedStateCreateInfoEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineColorBlendAdvancedStateCreateInfoEXT>
                       (alloc,count);
    if (pVVar1 != (VkPipelineColorBlendAdvancedStateCreateInfoEXT *)0x0) {
      pVVar1 = (VkPipelineColorBlendAdvancedStateCreateInfoEXT *)memmove(pVVar1,src,count << 5);
      return pVVar1;
    }
  }
  return (VkPipelineColorBlendAdvancedStateCreateInfoEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}